

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::(anonymous_namespace)::TwoWayPipeEnd> __thiscall
kj::
heap<kj::(anonymous_namespace)::TwoWayPipeEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe>,kj::Own<kj::(anonymous_namespace)::AsyncPipe>>
          (kj *this,Own<kj::(anonymous_namespace)::AsyncPipe> *params,
          Own<kj::(anonymous_namespace)::AsyncPipe> *params_1)

{
  TwoWayPipeEnd *this_00;
  Own<kj::(anonymous_namespace)::AsyncPipe> *pOVar1;
  TwoWayPipeEnd *extraout_RDX;
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd> OVar2;
  Own<kj::(anonymous_namespace)::AsyncPipe> local_40;
  Own<kj::(anonymous_namespace)::AsyncPipe> local_30;
  Own<kj::(anonymous_namespace)::AsyncPipe> *local_20;
  Own<kj::(anonymous_namespace)::AsyncPipe> *params_local_1;
  Own<kj::(anonymous_namespace)::AsyncPipe> *params_local;
  
  local_20 = params_1;
  params_local_1 = params;
  params_local = (Own<kj::(anonymous_namespace)::AsyncPipe> *)this;
  this_00 = (TwoWayPipeEnd *)operator_new(0x38);
  pOVar1 = fwd<kj::Own<kj::(anonymous_namespace)::AsyncPipe>>(params_local_1);
  Own<kj::(anonymous_namespace)::AsyncPipe>::Own(&local_30,pOVar1);
  pOVar1 = fwd<kj::Own<kj::(anonymous_namespace)::AsyncPipe>>(local_20);
  Own<kj::(anonymous_namespace)::AsyncPipe>::Own(&local_40,pOVar1);
  anon_unknown_77::TwoWayPipeEnd::TwoWayPipeEnd(this_00,&local_30,&local_40);
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd>::Own
            ((Own<kj::(anonymous_namespace)::TwoWayPipeEnd> *)this,this_00,
             (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::TwoWayPipeEnd>::instance);
  Own<kj::(anonymous_namespace)::AsyncPipe>::~Own(&local_40);
  Own<kj::(anonymous_namespace)::AsyncPipe>::~Own(&local_30);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}